

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

void __thiscall Lexical::Lexical(Lexical *this,Parsing *parsing_)

{
  Node local_d8;
  int local_8c [4];
  allocator local_79;
  string local_78 [32];
  Word local_58;
  Parsing *local_18;
  Parsing *parsing__local;
  Lexical *this_local;
  
  local_18 = parsing_;
  parsing__local = &this->parsing;
  Parsing::Parsing(&this->parsing);
  std::vector<Word,_std::allocator<Word>_>::vector(&this->words);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->relationOperators);
  std::vector<Procedure,_std::allocator<Procedure>_>::vector(&this->procedureTable);
  Node::Node(&this->root);
  this->procedureCnt = 0;
  Generator::Generator(&this->generator);
  Parsing::operator=(&this->parsing,local_18);
  std::vector<Word,_std::allocator<Word>_>::operator=(&this->words,&local_18->words);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  local_8c[3] = 0;
  local_8c[2] = 0;
  local_8c[1] = 0;
  local_8c[0] = 0;
  Word::Word(&local_58,(string *)local_78,local_8c + 3,local_8c + 2,local_8c + 1,local_8c);
  std::vector<Word,_std::allocator<Word>_>::emplace_back<Word>(&this->words,&local_58);
  Word::~Word(&local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  this->wordIndex = -1;
  this->nodeCnt = 0;
  this->lastErrorCode = -1;
  this->lastErrorIndex = -1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [2])0x11e115);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [2])"#");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [2])"<");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [3])"<=");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[2]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [2])">");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->relationOperators,(char (*) [3])">=");
  mainProgram(&local_d8,this);
  Node::operator=(&this->root,&local_d8);
  Node::~Node(&local_d8);
  return;
}

Assistant:

Lexical(const Parsing &parsing_) {
		parsing = parsing_;
		words = parsing_.words;
		words.emplace_back(Word("", 0, 0, 0, 0));
		wordIndex = -1;
		nodeCnt = 0;
		lastErrorIndex = lastErrorCode = -1;
		relationOperators.emplace_back("=");
		relationOperators.emplace_back("#");
		relationOperators.emplace_back("<");
		relationOperators.emplace_back("<=");
		relationOperators.emplace_back(">");
		relationOperators.emplace_back(">=");

		root = mainProgram();
	}